

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evutil_rand.c
# Opt level: O1

void evutil_secure_rng_get_bytes(void *buf,size_t n)

{
  int iVar1;
  uchar uVar2;
  uchar uVar3;
  bool bVar4;
  __pid_t _Var5;
  byte bVar6;
  
  if (arc4rand_lock != (void *)0x0) {
    (*evthread_lock_fns_.lock)(0,arc4rand_lock);
  }
  _Var5 = getpid();
  if (((arc4_count < 1) || ((rs_initialized & 1) == 0)) || (arc4_stir_pid != _Var5)) {
    arc4_stir_pid = _Var5;
    arc4_stir();
  }
  if (n != 0) {
    do {
      iVar1 = arc4_count + -1;
      bVar4 = arc4_count < 2;
      arc4_count = iVar1;
      if (bVar4) {
        arc4_stir();
      }
      rs.i = rs.i + 1;
      uVar2 = rs.s[rs.i];
      bVar6 = rs.j + uVar2;
      uVar3 = rs.s[bVar6];
      rs.j = bVar6;
      rs.s[rs.i] = uVar3;
      rs.s[bVar6] = uVar2;
      *(uchar *)((long)buf + (n - 1)) = rs.s[(byte)(uVar3 + uVar2)];
      n = n - 1;
    } while (n != 0);
  }
  if (arc4rand_lock == (void *)0x0) {
    return;
  }
  (*evthread_lock_fns_.unlock)(0,arc4rand_lock);
  return;
}

Assistant:

void
evutil_secure_rng_get_bytes(void *buf, size_t n)
{
	ev_arc4random_buf(buf, n);
}